

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

void __thiscall AddrManImpl::MakeTried(AddrManImpl *this,AddrInfo *info,int nId)

{
  int *piVar1;
  uint256 *nKey;
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  *this_00;
  string_view source_file;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Network NVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  mapped_type *this_01;
  Logger *pLVar9;
  uint uVar10;
  uint bucket;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int nUBucketPos;
  int nUBucket;
  int nIdEvict;
  int nKBucketPos;
  int nKBucket;
  string log_msg;
  int *in_stack_fffffffffffffec0;
  int local_110;
  int local_10c;
  int local_108;
  uint local_104;
  undefined1 local_100 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [7];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  nKey = &this->nKey;
  iVar4 = AddrInfo::GetNewBucket(info,nKey,&info->source,this->m_netgroupman);
  uVar10 = 0;
  do {
    bucket = iVar4 + uVar10 & 0x3ff;
    uVar5 = AddrInfo::GetBucketPosition(info,nKey,true,bucket);
    lVar2 = (ulong)(bucket << 8) + 0x10178;
    if (*(int *)((long)this->vvNew[0] + (ulong)uVar5 * 4 + lVar2 + -0x10178) == nId) {
      *(undefined4 *)((long)this->vvNew[0] + (ulong)uVar5 * 4 + lVar2 + -0x10178) = 0xffffffff;
      piVar1 = &info->nRefCount;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
LAB_0044f93a:
        this->nNew = this->nNew + -1;
        this_00 = &this->m_network_counts;
        local_58._M_dataplus._M_p._0_4_ = CNetAddr::GetNetwork((CNetAddr *)info);
        pmVar7 = std::__detail::
                 _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,(key_type *)&local_58);
        pmVar7->n_new = pmVar7->n_new - 1;
        if (info->nRefCount != 0) {
          __assert_fail("info.nRefCount == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                        ,0x1fd,"void AddrManImpl::MakeTried(AddrInfo &, int)");
        }
        local_100._0_4_ = AddrInfo::GetTriedBucket(info,nKey,this->m_netgroupman);
        local_104 = AddrInfo::GetBucketPosition(info,nKey,false,local_100._0_4_);
        if (this->vvTried[(int)local_100._0_4_][local_104] != -1) {
          local_108 = this->vvTried[(int)local_100._0_4_][local_104];
          sVar8 = std::
                  _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(&(this->mapInfo)._M_h,&local_108);
          if (sVar8 != 1) {
            __assert_fail("mapInfo.count(nIdEvict) == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                          ,0x207,"void AddrManImpl::MakeTried(AddrInfo &, int)");
          }
          this_01 = std::__detail::
                    _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->mapInfo,&local_108);
          this_01->fInTried = false;
          this->vvTried[(int)local_100._0_4_][(int)local_104] = -1;
          this->nTried = this->nTried + -1;
          NVar6 = CNetAddr::GetNetwork((CNetAddr *)this_01);
          local_58._M_dataplus._M_p._0_4_ = NVar6;
          pmVar7 = std::__detail::
                   _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,(key_type *)&local_58);
          pmVar7->n_tried = pmVar7->n_tried - 1;
          local_10c = AddrInfo::GetNewBucket(this_01,nKey,&this_01->source,this->m_netgroupman);
          local_110 = AddrInfo::GetBucketPosition(this_01,nKey,true,local_10c);
          ClearNew(this,local_10c,local_110);
          if (this->vvNew[local_10c][local_110] != -1) {
            __assert_fail("vvNew[nUBucket][nUBucketPos] == -1",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                          ,0x214,"void AddrManImpl::MakeTried(AddrInfo &, int)");
          }
          this_01->nRefCount = 1;
          this->vvNew[local_10c][local_110] = local_108;
          this->nNew = this->nNew + 1;
          local_58._M_dataplus._M_p._0_4_ = CNetAddr::GetNetwork((CNetAddr *)this_01);
          pmVar7 = std::__detail::
                   _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,(key_type *)&local_58);
          pmVar7->n_new = pmVar7->n_new + 1;
          pLVar9 = LogInstance();
          bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar9,ADDRMAN,Debug);
          if (bVar3) {
            CService::ToStringAddrPort_abi_cxx11_((string *)(local_100 + 8),(CService *)this_01);
            pLVar9 = LogInstance();
            bVar3 = BCLog::Logger::Enabled(pLVar9);
            if (bVar3) {
              local_58._M_string_length = 0;
              local_58.field_2._M_local_buf[0] = '\0';
              local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
              tinyformat::format<std::__cxx11::string,int,int,int,int>
                        (&local_78,
                         (tinyformat *)"Moved %s from tried[%i][%i] to new[%i][%i] to make space\n",
                         local_100 + 8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,(int *)&local_104,&local_10c,&local_110,in_stack_fffffffffffffec0
                        );
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&local_58,&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              pLVar9 = LogInstance();
              local_78._M_dataplus._M_p = (pointer)0x54;
              local_78._M_string_length = 0x8522a8;
              source_file._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
              ;
              source_file._M_len = 0x54;
              str._M_str = local_58._M_dataplus._M_p;
              str._M_len = local_58._M_string_length;
              logging_function._M_str = "MakeTried";
              logging_function._M_len = 9;
              BCLog::Logger::LogPrintStr
                        (pLVar9,str,logging_function,source_file,0x21c,ADDRMAN,Debug);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,
                                CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                         local_58.field_2._M_local_buf[0]) + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._8_8_ != local_e8) {
              operator_delete((void *)local_100._8_8_,local_e8[0]._M_allocated_capacity + 1);
            }
          }
        }
        if (this->vvTried[(int)local_100._0_4_][(int)local_104] != -1) {
          __assert_fail("vvTried[nKBucket][nKBucketPos] == -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                        ,0x21e,"void AddrManImpl::MakeTried(AddrInfo &, int)");
        }
        this->vvTried[(int)local_100._0_4_][(int)local_104] = nId;
        this->nTried = this->nTried + 1;
        info->fInTried = true;
        NVar6 = CNetAddr::GetNetwork((CNetAddr *)info);
        local_58._M_dataplus._M_p._0_4_ = NVar6;
        pmVar7 = std::__detail::
                 _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,(key_type *)&local_58);
        pmVar7->n_tried = pmVar7->n_tried + 1;
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return;
      }
    }
    if (0x3fe < uVar10) goto LAB_0044f93a;
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void AddrManImpl::MakeTried(AddrInfo& info, int nId)
{
    AssertLockHeld(cs);

    // remove the entry from all new buckets
    const int start_bucket{info.GetNewBucket(nKey, m_netgroupman)};
    for (int n = 0; n < ADDRMAN_NEW_BUCKET_COUNT; ++n) {
        const int bucket{(start_bucket + n) % ADDRMAN_NEW_BUCKET_COUNT};
        const int pos{info.GetBucketPosition(nKey, true, bucket)};
        if (vvNew[bucket][pos] == nId) {
            vvNew[bucket][pos] = -1;
            info.nRefCount--;
            if (info.nRefCount == 0) break;
        }
    }
    nNew--;
    m_network_counts[info.GetNetwork()].n_new--;

    assert(info.nRefCount == 0);

    // which tried bucket to move the entry to
    int nKBucket = info.GetTriedBucket(nKey, m_netgroupman);
    int nKBucketPos = info.GetBucketPosition(nKey, false, nKBucket);

    // first make space to add it (the existing tried entry there is moved to new, deleting whatever is there).
    if (vvTried[nKBucket][nKBucketPos] != -1) {
        // find an item to evict
        int nIdEvict = vvTried[nKBucket][nKBucketPos];
        assert(mapInfo.count(nIdEvict) == 1);
        AddrInfo& infoOld = mapInfo[nIdEvict];

        // Remove the to-be-evicted item from the tried set.
        infoOld.fInTried = false;
        vvTried[nKBucket][nKBucketPos] = -1;
        nTried--;
        m_network_counts[infoOld.GetNetwork()].n_tried--;

        // find which new bucket it belongs to
        int nUBucket = infoOld.GetNewBucket(nKey, m_netgroupman);
        int nUBucketPos = infoOld.GetBucketPosition(nKey, true, nUBucket);
        ClearNew(nUBucket, nUBucketPos);
        assert(vvNew[nUBucket][nUBucketPos] == -1);

        // Enter it into the new set again.
        infoOld.nRefCount = 1;
        vvNew[nUBucket][nUBucketPos] = nIdEvict;
        nNew++;
        m_network_counts[infoOld.GetNetwork()].n_new++;
        LogDebug(BCLog::ADDRMAN, "Moved %s from tried[%i][%i] to new[%i][%i] to make space\n",
                 infoOld.ToStringAddrPort(), nKBucket, nKBucketPos, nUBucket, nUBucketPos);
    }
    assert(vvTried[nKBucket][nKBucketPos] == -1);

    vvTried[nKBucket][nKBucketPos] = nId;
    nTried++;
    info.fInTried = true;
    m_network_counts[info.GetNetwork()].n_tried++;
}